

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tok_write_defines(tokcxdef *ctx,osfildef *fp,errcxdef *ec)

{
  size_t sVar1;
  FILE *in_RSI;
  long in_RDI;
  char buf [4];
  tokdfdef *df;
  tokdfdef **dfp;
  int i;
  char *in_stack_ffffffffffffffc8;
  errcxdef *ctx_00;
  long *local_28;
  int local_1c;
  
  local_1c = 0x40;
  local_28 = (long *)(in_RDI + 0x2b0);
  do {
    if (local_1c == 0) {
      return;
    }
    for (ctx_00 = (errcxdef *)*local_28; ctx_00 != (errcxdef *)0x0;
        ctx_00 = (errcxdef *)ctx_00->errcxptr) {
      oswp2(&stack0xffffffffffffffcc,*(uint *)&ctx_00->errcxlgc);
      oswp2(&stack0xffffffffffffffce,*(uint *)((long)&ctx_00->errcxlgc + 4));
      sVar1 = fwrite(&stack0xffffffffffffffcc,4,1,in_RSI);
      if (sVar1 != 1) {
LAB_0011c70f:
        errsigf(ctx_00,in_stack_ffffffffffffffc8,0);
      }
      sVar1 = fwrite(ctx_00->errcxlog,(long)*(int *)&ctx_00->errcxlgc,1,in_RSI);
      if (sVar1 != 1) goto LAB_0011c70f;
      if (*(int *)((long)&ctx_00->errcxlgc + 4) != 0) {
        sVar1 = fwrite(&ctx_00->errcxofs,(long)*(int *)((long)&ctx_00->errcxlgc + 4),1,in_RSI);
        if (sVar1 != 1) goto LAB_0011c70f;
      }
    }
    oswp2(&stack0xffffffffffffffcc,0);
    sVar1 = fwrite(&stack0xffffffffffffffcc,4,1,in_RSI);
    if (sVar1 != 1) {
      errsigf(ctx_00,in_stack_ffffffffffffffc8,0);
    }
    local_28 = local_28 + 1;
    local_1c = local_1c + -1;
  } while( true );
}

Assistant:

void tok_write_defines(tokcxdef *ctx, osfildef *fp, errcxdef *ec)
{
    int        i;
    tokdfdef **dfp;
    tokdfdef  *df;
    char       buf[4];

    /* write each element of the hash chains */
    for (i = TOKDFHSHSIZ, dfp = ctx->tokcxdf ; i ; ++dfp, --i)
    {
        /* write each entry in this hash chain */
        for (df = *dfp ; df ; df = df->nxt)
        {
            /* write this entry */
            oswp2(buf, df->len);
            oswp2(buf + 2, df->explen);
            if (osfwb(fp, buf, 4)
                || osfwb(fp, df->nm, df->len)
                || (df->explen != 0 && osfwb(fp, df->expan, df->explen)))
                errsig(ec, ERR_WRTGAM);
        }

        /* write a zero-length entry to indicate the end of this chain */
        oswp2(buf, 0);
        if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
    }
}